

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

undefined8 __thiscall
adios2::helper::CommImplMPI::Irecv
          (CommImplMPI *this,void *buffer,size_t count,Datatype datatype,int source,int tag,
          string *hint)

{
  long lVar1;
  MPI_Datatype poVar2;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  Datatype in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  MPI_Request mpiReq_2;
  int batchSize_2;
  MPI_Request mpiReq_1;
  int batchSize_1;
  size_t remainder;
  MPI_Request mpiReq;
  int batchSize;
  size_t b;
  size_t position;
  size_t batches;
  unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
  req;
  pointer in_stack_fffffffffffffda8;
  CommReqImplMPI *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
  *__u;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  unsigned_long in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 uVar3;
  char *in_stack_fffffffffffffdf8;
  unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
  local_1b8;
  string local_1b0 [32];
  string local_190 [32];
  undefined1 local_170 [12];
  undefined4 local_164;
  string local_160 [32];
  string local_140 [32];
  undefined1 local_120 [12];
  undefined4 local_114;
  ulong local_110;
  string local_108 [16];
  string *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [12];
  undefined4 local_5c;
  ulong local_58;
  long local_50;
  ulong local_48;
  undefined4 local_28;
  Datatype local_24;
  ulong local_20;
  long local_18;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  operator_new(0x28);
  anon_unknown_1::ToMPI(local_24);
  CommReqImplMPI::CommReqImplMPI(in_stack_fffffffffffffdb0,(MPI_Datatype)in_stack_fffffffffffffda8);
  std::
  unique_ptr<adios2::helper::CommReqImplMPI,std::default_delete<adios2::helper::CommReqImplMPI>>::
  unique_ptr<std::default_delete<adios2::helper::CommReqImplMPI>,void>
            ((unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
              *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (local_20 < 0x7ffe7001) {
    local_164 = (undefined4)local_20;
    poVar2 = anon_unknown_1::ToMPI(local_24);
    in_stack_fffffffffffffdc4 =
         MPI_Irecv(local_18,local_20 & 0xffffffff,poVar2,local_28,in_stack_00000008,
                   *(undefined8 *)(in_RSI + 8),local_170);
    std::operator+(in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
    anon_unknown_1::CheckMPIReturn(in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    std::
    unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
    ::operator->((unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
                  *)0x1a242d);
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*&>
              ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (ompi_request_t **)in_stack_fffffffffffffdb8);
  }
  else {
    local_48 = local_20 / 0x7ffe7000;
    local_50 = 0;
    for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
      local_5c = 0x7ffe7000;
      lVar1 = local_18 + local_50;
      poVar2 = anon_unknown_1::ToMPI(local_24);
      MPI_Irecv(lVar1,0x7ffe7000,poVar2,local_28,in_stack_00000008,*(undefined8 *)(in_RSI + 8),
                local_68);
      std::__cxx11::to_string(in_stack_fffffffffffffde8);
      std::operator+((char *)in_stack_fffffffffffffdb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb0);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::operator+(in_stack_fffffffffffffdb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb0);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      anon_unknown_1::CheckMPIReturn(in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::
      unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
      ::operator->((unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
                    *)0x1a2078);
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*&>
                ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (ompi_request_t **)in_stack_fffffffffffffdb8);
      local_50 = local_50 + 0x7ffe7000;
    }
    local_110 = local_20 % 0x7ffe7000;
    if (local_110 != 0) {
      local_114 = (undefined4)local_110;
      lVar1 = local_18 + local_50;
      uVar3 = (undefined4)local_110;
      poVar2 = anon_unknown_1::ToMPI(local_24);
      MPI_Irecv(lVar1,uVar3,poVar2,local_28,in_stack_00000008,*(undefined8 *)(in_RSI + 8),local_120)
      ;
      std::operator+((char *)poVar2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar3,in_stack_fffffffffffffdf0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      anon_unknown_1::CheckMPIReturn(in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      std::
      unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
      ::operator->((unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
                    *)0x1a22d6);
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*&>
                ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (ompi_request_t **)in_stack_fffffffffffffdb8);
    }
  }
  __u = &local_1b8;
  std::unique_ptr<adios2::helper::CommReqImpl,std::default_delete<adios2::helper::CommReqImpl>>::
  unique_ptr<adios2::helper::CommReqImplMPI,std::default_delete<adios2::helper::CommReqImplMPI>,void>
            ((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
              *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),__u);
  adios2::helper::CommImpl::MakeReq(in_RDI,__u);
  std::unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>::
  ~unique_ptr((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
               *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  std::
  unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>::
  ~unique_ptr((unique_ptr<adios2::helper::CommReqImplMPI,_std::default_delete<adios2::helper::CommReqImplMPI>_>
               *)in_stack_fffffffffffffdb0);
  return in_RDI;
}

Assistant:

Comm::Req CommImplMPI::Irecv(void *buffer, size_t count, Datatype datatype, int source, int tag,
                             const std::string &hint) const
{
    auto req = std::unique_ptr<CommReqImplMPI>(new CommReqImplMPI(ToMPI(datatype)));

    if (count > DefaultMaxFileBatchSize)
    {
        const size_t batches = count / DefaultMaxFileBatchSize;
        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            int batchSize = static_cast<int>(DefaultMaxFileBatchSize);
            MPI_Request mpiReq;
            CheckMPIReturn(MPI_Irecv(static_cast<char *>(buffer) + position, batchSize,
                                     ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
                           "in call to Irecv batch " + std::to_string(b) + " " + hint + "\n");
            req->m_MPIReqs.emplace_back(mpiReq);

            position += DefaultMaxFileBatchSize;
        }

        const size_t remainder = count % DefaultMaxFileBatchSize;
        if (remainder > 0)
        {
            int batchSize = static_cast<int>(remainder);
            MPI_Request mpiReq;
            CheckMPIReturn(MPI_Irecv(static_cast<char *>(buffer) + position, batchSize,
                                     ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
                           "in call to Irecv remainder batch " + hint + "\n");
            req->m_MPIReqs.emplace_back(mpiReq);
        }
    }
    else
    {
        int batchSize = static_cast<int>(count);
        MPI_Request mpiReq;
        CheckMPIReturn(
            MPI_Irecv(buffer, batchSize, ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
            " in call to Isend with single batch " + hint + "\n");
        req->m_MPIReqs.emplace_back(mpiReq);
    }

    return MakeReq(std::move(req));
}